

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsPendulum_dns.c
# Opt level: O3

int GetSol(void *cvode_mem,N_Vector yy0,sunrealtype rtol,sunrealtype atol,sunrealtype tf,int nout,
          int proj,int projerr,N_Vector yref)

{
  uint uVar1;
  undefined8 uVar2;
  double *pdVar3;
  FILE *__stream;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  long netf;
  long ncfn;
  long nfeLS;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  sunrealtype t;
  char outname [100];
  
  if (proj == 0) {
    uVar1 = CVodeSetProjFrequency(cvode_mem,0);
    if (-1 < (int)uVar1) {
      printf("  NO    ");
LAB_001031a4:
      uVar2 = N_VNew_Serial(4,sunctx);
      N_VScale(0x3ff0000000000000,yy0,uVar2);
      pdVar3 = (double *)N_VGetArrayPointer(uVar2);
      uVar1 = CVodeReInit(0,cvode_mem,yy0);
      if ((int)uVar1 < 0) {
        pcVar4 = "CVodeReInit";
      }
      else {
        uVar1 = CVodeSStolerances(rtol,atol,cvode_mem);
        if (-1 < (int)uVar1) {
          pcVar4 = "cvsPendulum_dns_rtol_%03.2e_atol_%03.2e_proj.txt";
          if (proj == 0) {
            pcVar4 = "cvsPendulum_dns_rtol_%03.2e_atol_%03.2e.txt";
          }
          sprintf(outname,pcVar4,rtol,atol);
          __stream = fopen(outname,"w");
          fprintf(__stream,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",0,*pdVar3,pdVar3[1],pdVar3[2]
                  ,pdVar3[3]);
          if (0 < nout) {
            iVar6 = 0;
            dVar7 = tf / (double)nout;
            do {
              uVar1 = CVodeSetStopTime(dVar7,cvode_mem);
              if ((int)uVar1 < 0) {
                pcVar4 = "CVodeSetStopTime";
LAB_0010363a:
                fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar4,(ulong)uVar1);
                N_VDestroy_Serial(uVar2);
                fclose(__stream);
                return uVar1;
              }
              uVar1 = CVode(dVar7,cvode_mem,uVar2,&t,1);
              if ((int)uVar1 < 0) {
                pcVar4 = "CVode";
                goto LAB_0010363a;
              }
              fprintf(__stream,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",t,*pdVar3,pdVar3[1],
                      pdVar3[2],pdVar3[3]);
              dVar8 = tf;
              if (iVar6 < nout + -1) {
                dVar8 = dVar7 + tf / (double)nout;
              }
              iVar6 = iVar6 + 1;
              dVar7 = dVar8;
            } while (nout != iVar6);
          }
          fclose(__stream);
          dVar7 = *pdVar3;
          dVar8 = pdVar3[1];
          N_VLinearSum(0x3ff0000000000000,uVar2,yref,uVar2);
          N_VAbs(uVar2,uVar2);
          printf("%8.2e  %8.2e  %8.2e  %8.2e  |  %8.2e  |",*pdVar3,pdVar3[1],pdVar3[2],pdVar3[3],
                 ABS(dVar7 * dVar7 + dVar8 * dVar8 + -1.0));
          N_VDestroy_Serial(uVar2);
          uVar1 = CVodeGetNumSteps(cvode_mem,&nst);
          if ((int)uVar1 < 0) {
            uVar5 = (ulong)uVar1;
            pcVar4 = "CVodeGetNumSteps";
          }
          else {
            uVar1 = CVodeGetNumRhsEvals(cvode_mem,&nfe);
            if ((int)uVar1 < 0) {
              uVar5 = (ulong)uVar1;
              pcVar4 = "CVodeGetNumFctEvals";
            }
            else {
              uVar1 = CVodeGetNumLinSolvSetups(cvode_mem,&nsetups);
              if ((int)uVar1 < 0) {
                uVar5 = (ulong)uVar1;
                pcVar4 = "CVodeGetNumLinSolvSetups";
              }
              else {
                uVar1 = CVodeGetNumErrTestFails(cvode_mem,&netf);
                if ((int)uVar1 < 0) {
                  uVar5 = (ulong)uVar1;
                  pcVar4 = "CVodeGetNumErrTestFails";
                }
                else {
                  uVar1 = CVodeGetNumNonlinSolvConvFails(cvode_mem,&ncfn);
                  if ((int)uVar1 < 0) {
                    uVar5 = (ulong)uVar1;
                    pcVar4 = "CVodeGetNumNonlinSolvConvFails";
                  }
                  else {
                    uVar1 = CVodeGetNumJacEvals(cvode_mem,&nje);
                    if ((int)uVar1 < 0) {
                      uVar5 = (ulong)uVar1;
                      pcVar4 = "CVodeGetNumJacEvals";
                    }
                    else {
                      uVar1 = CVodeGetNumLinRhsEvals(cvode_mem,&nfeLS);
                      if (-1 < (int)uVar1) {
                        printf(" %6ld   %6ld+%-4ld     %4ld (%3ld)     |  %3ld  %3ld\n",nst,nfe,
                               nfeLS,nsetups,nje,ncfn,netf);
                        return 0;
                      }
                      uVar5 = (ulong)uVar1;
                      pcVar4 = "CVodeGetNumLinRhsEvals";
                    }
                  }
                }
              }
            }
          }
          fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar4,uVar5);
          return (int)uVar5;
        }
        pcVar4 = "CVodeSStolerances";
      }
      fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar4,(ulong)uVar1);
      N_VDestroy_Serial(uVar2);
      return uVar1;
    }
  }
  else {
    printf("  YES   ");
    uVar1 = CVodeSetProjFrequency(cvode_mem,1);
    if (-1 < (int)uVar1) {
      uVar1 = CVodeSetProjErrEst(cvode_mem,projerr);
      if (-1 < (int)uVar1) goto LAB_001031a4;
      pcVar4 = "CVodeSetProjErrEst";
      goto LAB_001034bf;
    }
  }
  pcVar4 = "CVodeSetProjFrequency";
LAB_001034bf:
  fprintf(_stderr,"\nERROR: %s() returned = %d\n\n",pcVar4,(ulong)uVar1);
  return 1;
}

Assistant:

int GetSol(void* cvode_mem, N_Vector yy0, sunrealtype rtol, sunrealtype atol,
           sunrealtype tf, int nout, sunbooleantype proj,
           sunbooleantype projerr, N_Vector yref)
{
  char outname[100];          /* output file name */
  FILE* FID           = NULL; /* output file      */
  N_Vector yy         = NULL; /* solution vector  */
  sunrealtype* yydata = NULL; /* vector data      */

  int retval;         /* reusable return flag */
  int out;            /* output counter       */
  sunrealtype dtout;  /* output frequency     */
  sunrealtype tout;   /* output time          */
  sunrealtype t;      /* return time          */
  sunrealtype x, y;   /* position values      */
  sunrealtype xd, yd; /* velocity values      */
  sunrealtype g;      /* constraint value     */

  /* Integrator stats */
  long int nst, nfe, nsetups, nje, nfeLS, ncfn, netf;

  /* Enable or disable projection */
  if (proj)
  {
    printf("  YES   ");
    retval = CVodeSetProjFrequency(cvode_mem, 1);
    if (check_retval(&retval, "CVodeSetProjFrequency", 1)) { return (1); }

    /* Enable or disable error projection */
    retval = CVodeSetProjErrEst(cvode_mem, projerr);
    if (check_retval(&retval, "CVodeSetProjErrEst", 1)) { return (1); }
  }
  else
  {
    retval = CVodeSetProjFrequency(cvode_mem, 0);
    if (check_retval(&retval, "CVodeSetProjFrequency", 1)) { return (1); }
    printf("  NO    ");
  }

  /* Create vector to store the solution */
  yy = N_VNew_Serial(4, sunctx);

  /* Copy initial condition into solution vector */
  N_VScale(ONE, yy0, yy);

  /* Get pointer to vector data */
  yydata = N_VGetArrayPointer(yy);

  /* Reinitialize CVODES for this run */
  retval = CVodeReInit(cvode_mem, ZERO, yy0);
  if (check_retval(&retval, "CVodeReInit", 1))
  {
    N_VDestroy_Serial(yy);
    return (retval);
  }

  /* Set integration tolerances for this run */
  retval = CVodeSStolerances(cvode_mem, rtol, atol);
  if (check_retval(&retval, "CVodeSStolerances", 1))
  {
    N_VDestroy_Serial(yy);
    return (retval);
  }

  /* Open output file */
  if (proj)
  {
    sprintf(outname,
            "cvsPendulum_dns_rtol_%03.2" ESYM "_atol_%03.2" ESYM "_proj.txt",
            rtol, atol);
  }
  else
  {
    sprintf(outname, "cvsPendulum_dns_rtol_%03.2" ESYM "_atol_%03.2" ESYM ".txt",
            rtol, atol);
  }
  FID = fopen(outname, "w");

  /* Output initial condition */
  fprintf(FID,
          "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
          " %24.16" ESYM "\n",
          ZERO, yydata[0], yydata[1], yydata[2], yydata[3]);

  /* Integrate to tf and peridoically output the solution */
  dtout = tf / nout;
  tout  = dtout;

  for (out = 0; out < nout; out++)
  {
    /* Set stop time (do not interpolate output) */
    retval = CVodeSetStopTime(cvode_mem, tout);
    if (check_retval(&retval, "CVodeSetStopTime", 1))
    {
      N_VDestroy_Serial(yy);
      fclose(FID);
      return (retval);
    }

    /* Integrate to tout */
    retval = CVode(cvode_mem, tout, yy, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1))
    {
      N_VDestroy_Serial(yy);
      fclose(FID);
      return (retval);
    }

    /* Write output */
    fprintf(FID,
            "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
            " %24.16" ESYM "\n",
            t, yydata[0], yydata[1], yydata[2], yydata[3]);

    /* Update output time */
    if (out < nout - 1) { tout += dtout; }
    else { tout = tf; }
  }

  /* Close output file */
  fclose(FID);

  /* Compute the constraint violation */
  x = yydata[0];
  y = yydata[1];
  g = ABS(x * x + y * y - ONE);

  /* Compute the absolute error compared to the reference solution */
  N_VLinearSum(ONE, yy, -ONE, yref, yy);
  N_VAbs(yy, yy);

  x  = yydata[0];
  y  = yydata[1];
  xd = yydata[2];
  yd = yydata[3];

  /* Output errors */
  printf("%8.2" ESYM "  %8.2" ESYM "  %8.2" ESYM "  %8.2" ESYM "  |  %8.2" ESYM
         "  |",
         x, y, xd, yd, g);

  /* Free solution vector */
  N_VDestroy_Serial(yy);

  /* Get integrator stats */
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  if (check_retval(&retval, "CVodeGetNumSteps", 1)) { return (retval); }

  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  if (check_retval(&retval, "CVodeGetNumFctEvals", 1)) { return (retval); }

  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  if (check_retval(&retval, "CVodeGetNumLinSolvSetups", 1)) { return (retval); }

  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  if (check_retval(&retval, "CVodeGetNumErrTestFails", 1)) { return (retval); }

  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  if (check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1))
  {
    return (retval);
  }

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  if (check_retval(&retval, "CVodeGetNumJacEvals", 1)) { return (retval); }

  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  if (check_retval(&retval, "CVodeGetNumLinRhsEvals", 1)) { return (retval); }

  /* Output stats */
  printf(" %6ld   %6ld+%-4ld     %4ld (%3ld)     |  %3ld  %3ld\n", nst, nfe,
         nfeLS, nsetups, nje, ncfn, netf);

  return (0);
}